

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_call(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  ptrdiff_t nargs_local;
  BCReg func_local;
  jit_State *J_local;
  
  rec_call_setup(J,func,nargs);
  J->framedepth = J->framedepth + 1;
  J->base = J->base + (func + 2);
  J->baseslot = func + 2 + J->baseslot;
  if (0xf9 < J->baseslot + J->maxslot) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  return;
}

Assistant:

void lj_record_call(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  /* Bump frame. */
  J->framedepth++;
  J->base += func+1+LJ_FR2;
  J->baseslot += func+1+LJ_FR2;
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}